

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::Terminate(void)

{
  undefined *puVar1;
  uint uVar2;
  CodeDescriptor *pCVar3;
  uint local_c;
  uint i;
  
  ClearImportPaths();
  FastVector<char_*,_false,_false>::reset((FastVector<char_*,_false,_false> *)importPaths);
  local_c = 0;
  while( true ) {
    uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                      ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
    puVar1 = NULLC::dealloc;
    if (uVar2 <= local_c) break;
    pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_c);
    (*(code *)puVar1)(pCVar3->name);
    pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_c);
    if (pCVar3->binary != (char *)0x0) {
      operator_delete__(pCVar3->binary);
    }
    pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_c);
    if (pCVar3->lexemes != (Lexeme *)0x0) {
      operator_delete__(pCVar3->lexemes);
    }
    local_c = local_c + 1;
  }
  FastVector<BinaryCache::CodeDescriptor,_false,_false>::clear
            ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
  FastVector<BinaryCache::CodeDescriptor,_false,_false>::reset
            ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
  if (lastBytecode != (void *)0x0) {
    operator_delete__(lastBytecode);
  }
  lastBytecode = (void *)0x0;
  return;
}

Assistant:

void BinaryCache::Terminate()
{
	ClearImportPaths();

	importPaths.reset();

	for(unsigned int i = 0; i < cache.size(); i++)
	{
		NULLC::dealloc((void*)cache[i].name);
		delete[] cache[i].binary;
		delete[] cache[i].lexemes;
	}
	cache.clear();
	cache.reset();

	delete[] lastBytecode;
	lastBytecode = NULL;
}